

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O2

char * apprun_argv_to_env(char **string_list)

{
  uint uVar1;
  size_t sVar2;
  char *__s;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar1 = apprun_string_list_len(string_list);
  uVar3 = (ulong)uVar1;
  iVar5 = 0;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    sVar2 = strlen(string_list[uVar4]);
    iVar5 = iVar5 + (int)sVar2 + 3;
  }
  __s = (char *)calloc((ulong)(iVar5 + 1),1);
  for (uVar4 = 1; uVar4 - uVar3 != 1; uVar4 = uVar4 + 1) {
    sVar2 = strlen(__s);
    (__s + sVar2)[0] = '\"';
    (__s + sVar2)[1] = '\0';
    strcat(__s,string_list[uVar4 - 1]);
    sVar2 = strlen(__s);
    (__s + sVar2)[0] = '\"';
    (__s + sVar2)[1] = '\0';
    if (uVar4 < uVar3) {
      sVar2 = strlen(__s);
      (__s + sVar2)[0] = ' ';
      (__s + sVar2)[1] = '\0';
    }
  }
  return __s;
}

Assistant:

char *apprun_argv_to_env(char *const *string_list) {
    unsigned string_list_len = apprun_string_list_len(string_list);
    unsigned str_size = 0;

    // space required by two quotation marks and one space
    const unsigned extra_chars_len = 3;

    for (int i = 0; i < string_list_len; i++)
        str_size += strlen(string_list[i]) + extra_chars_len;

    char *str = calloc(str_size + 1, sizeof(char));
    memset(str, 0, str_size + 1);

    for (int i = 0; i < string_list_len; i++) {
        strcat(str, "\"");
        strcat(str, string_list[i]);
        strcat(str, "\"");
        if (i + 1 < string_list_len)
            strcat(str, " ");
    }

    return str;
}